

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O3

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoTriangle>::TPZMultiphysicsCompEl
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoTriangle> *this,TPZCompMesh *mesh,TPZGeoEl *ref)

{
  long lVar1;
  
  *(undefined ***)&(this->super_TPZMultiphysicsElement).super_TPZCompEl = &PTR__TPZSavable_01942300;
  TPZMultiphysicsElement::TPZMultiphysicsElement
            (&this->super_TPZMultiphysicsElement,&PTR_PTR_0193fd00,mesh,ref);
  *(undefined ***)&(this->super_TPZMultiphysicsElement).super_TPZCompEl =
       &PTR__TPZMultiphysicsCompEl_0193f9f0;
  (this->fElementVec).super_TPZVec<TPZCompElSide>.fStore = (TPZCompElSide *)0x0;
  (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements = 0;
  (this->fElementVec).super_TPZVec<TPZCompElSide>.fNAlloc = 0;
  (this->fElementVec).super_TPZVec<TPZCompElSide>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_019444a0;
  lVar1 = 0xa0;
  do {
    *(undefined8 *)
     ((long)(this->super_TPZMultiphysicsElement).fActiveApproxSpace.fExtAlloc + lVar1 + -0x68) = 0;
    *(undefined4 *)
     ((long)(this->super_TPZMultiphysicsElement).fActiveApproxSpace.fExtAlloc + lVar1 + -0x60) =
         0xffffffff;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0xf0);
  (this->fElementVec).super_TPZVec<TPZCompElSide>.fStore = (this->fElementVec).fExtAlloc;
  (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements = 0;
  (this->fElementVec).super_TPZVec<TPZCompElSide>.fNAlloc = 0;
  (this->fConnectIndexes)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
  (this->fConnectIndexes).fStore = (long *)0x0;
  (this->fConnectIndexes).fNElements = 0;
  (this->fConnectIndexes).fNAlloc = 0;
  TPZIntTriang::TPZIntTriang(&this->fIntRule,2);
  return;
}

Assistant:

TPZMultiphysicsCompEl<TGeometry>::TPZMultiphysicsCompEl(TPZCompMesh &mesh, TPZGeoEl *ref) :TPZRegisterClassId(&TPZMultiphysicsCompEl::ClassId),
TPZMultiphysicsElement(mesh, ref), fElementVec(0) {
}